

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interleaved_sudoku.cpp
# Opt level: O3

void __thiscall
InterleavedSudoku::chooseOpenFieldInTestFieldsAndFixToSolution
          (InterleavedSudoku *this,
          vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_> *testFields,
          int maxPossible,bool fixFieldChooseRandomly,bool debug)

{
  pointer psVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int value;
  ostream *poVar6;
  long *plVar7;
  undefined7 in_register_00000009;
  pointer psVar8;
  
  if ((int)CONCAT71(in_register_00000009,fixFieldChooseRandomly) == 0) {
    psVar1 = (testFields->
             super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    iVar4 = 0;
    for (psVar8 = (testFields->
                  super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; psVar8 != psVar1; psVar8 = psVar8 + 1)
    {
      iVar2 = Field::value((psVar8->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
      if ((iVar2 == 0) &&
         (iVar2 = Field::n_possible((psVar8->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>).
                                    _M_ptr), iVar2 == maxPossible)) {
        iVar2 = Field::pos_x((psVar8->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
        ;
        iVar3 = Field::pos_y((psVar8->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
        ;
        iVar4 = Field::pos_z((psVar8->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
        ;
        goto LAB_00116c3b;
      }
    }
    iVar3 = 0;
    iVar2 = 0;
  }
  else {
    do {
      iVar2 = rand();
      iVar2 = iVar2 % (this->super_Sudoku).squared_size_;
      iVar3 = rand();
      iVar3 = iVar3 % (this->super_Sudoku).squared_size_;
      iVar4 = rand();
      iVar4 = iVar4 % 2;
      iVar5 = (this->super_Sudoku).squared_size_;
      iVar5 = Field::value((testFields->
                           super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                           )._M_impl.super__Vector_impl_data._M_start
                           [(iVar5 * iVar4 + iVar3) * iVar5 + iVar2].
                           super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    } while (iVar5 != 0);
  }
LAB_00116c3b:
  iVar5 = (this->super_Sudoku).squared_size_;
  value = Field::value((this->super_Sudoku).fields_.
                       super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                       ._M_impl.super__Vector_impl_data._M_start
                       [(iVar5 * iVar4 + iVar3) * iVar5 + iVar2].
                       super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  iVar5 = (this->super_Sudoku).squared_size_;
  Field::setValue((testFields->
                  super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                  )._M_impl.super__Vector_impl_data._M_start
                  [(iVar5 * iVar4 + iVar3) * iVar5 + iVar2].
                  super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr,value);
  iVar5 = (this->super_Sudoku).squared_size_;
  Field::setFixed((testFields->
                  super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                  )._M_impl.super__Vector_impl_data._M_start
                  [(iVar5 * iVar4 + iVar3) * iVar5 + iVar2].
                  super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr,true);
  if (debug) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Fix field (",0xb);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") to value ",0xb);
    plVar7 = (long *)std::ostream::operator<<(poVar6,value);
    std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
    std::ostream::put((char)plVar7);
    std::ostream::flush();
    return;
  }
  return;
}

Assistant:

void InterleavedSudoku::chooseOpenFieldInTestFieldsAndFixToSolution(std::vector< std::shared_ptr< Field > >& testFields, int maxPossible, bool fixFieldChooseRandomly, bool debug)
{
  int posXtoFix = 0;
  int posYtoFix = 0;
  int posZtoFix = 0;

  if(fixFieldChooseRandomly)
  {
    for(;;)
    {
      int x = rand() % (squared_size_);
      int y = rand() % (squared_size_);
      int z = rand() % 2;
      if(testFields[index(x,y,z)]->value() == 0)
      {
	posXtoFix = x;
	posYtoFix = y;
	posZtoFix = z;
	break;
      }
    }
  }
  else
  {
    //take the first field that has the maximum number of possibilities
    for(auto &field : testFields)
    {
      if(field->value() != 0)
	continue;

      if(field->n_possible() == maxPossible)
      {
	posXtoFix = field->pos_x();
	posYtoFix = field->pos_y();
	posZtoFix = field->pos_z();
	break;
      }
    }
  }

  int correctValue = fields_[index(posXtoFix, posYtoFix, posZtoFix)]->value();

  testFields[index(posXtoFix, posYtoFix, posZtoFix)]->setValue(correctValue);
  testFields[index(posXtoFix, posYtoFix, posZtoFix)]->setFixed(true);

  if(debug)
    std::cout<<"Fix field ("<<posXtoFix<<","<<posYtoFix<<","<<posZtoFix<<") to value "<<correctValue<<std::endl;
}